

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tinsert(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  lua_Integer lVar4;
  
  luaL_checktype(L,1,5);
  iVar1 = luaL_len(L,1);
  iVar1 = iVar1 + 1;
  iVar2 = lua_gettop(L);
  iVar3 = iVar1;
  if (iVar2 != 2) {
    if (iVar2 != 3) {
      iVar3 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar3;
    }
    lVar4 = luaL_checkinteger(L,2);
    iVar3 = (int)lVar4;
    if (iVar1 < iVar3 || iVar3 < 1) {
      luaL_argerror(L,2,"position out of bounds");
    }
    while (iVar3 < iVar1) {
      lua_rawgeti(L,1,iVar1 + -1);
      lua_rawseti(L,1,iVar1);
      iVar1 = iVar1 + -1;
    }
  }
  lua_rawseti(L,1,iVar3);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  int e = aux_getn(L, 1) + 1;  /* first empty element */
  int pos;  /* where to insert new element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      int i;
      pos = luaL_checkint(L, 2);  /* 2nd argument is the position */
      luaL_argcheck(L, 1 <= pos && pos <= e, 2, "position out of bounds");
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_rawgeti(L, 1, i-1);
        lua_rawseti(L, 1, i);  /* t[i] = t[i-1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to " LUA_QL("insert"));
    }
  }
  lua_rawseti(L, 1, pos);  /* t[pos] = v */
  return 0;
}